

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

cbtBroadphasePair * __thiscall
cbtHashedOverlappingPairCache::internalAddPair
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          )

{
  int iVar1;
  cbtOverlappingPairCallback *pcVar2;
  int *piVar3;
  int proxyId1;
  cbtBroadphasePair *pcVar4;
  long lVar5;
  int proxyId2;
  int iVar6;
  long lVar7;
  uint uVar8;
  cbtBroadphaseProxy *pcVar9;
  uint uVar10;
  int iVar11;
  cbtBroadphasePair *pcVar12;
  cbtBroadphaseProxy *pcVar13;
  
  pcVar9 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pcVar9 = proxy0;
    proxy0 = proxy1;
  }
  uVar8 = pcVar9->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar8 = ~(uVar8 << 0xf) + uVar8;
  uVar8 = (uVar8 >> 10 ^ uVar8) * 9;
  uVar8 = uVar8 >> 6 ^ uVar8;
  uVar8 = ~(uVar8 << 0xb) + uVar8;
  uVar8 = uVar8 >> 0x10 ^ uVar8;
  iVar1 = (this->m_overlappingPairArray).m_capacity;
  uVar10 = iVar1 - 1U & uVar8;
  iVar11 = (this->m_hashTable).m_data[(int)uVar10];
  if (iVar11 != -1) {
    pcVar4 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pcVar4[iVar11].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pcVar12 = pcVar4 + iVar11, pcVar12->m_pProxy1->m_uniqueId == pcVar9->m_uniqueId))
      goto LAB_008c4c21;
      iVar11 = (this->m_next).m_data[iVar11];
    } while (iVar11 != -1);
  }
  pcVar12 = (cbtBroadphasePair *)0x0;
LAB_008c4c21:
  if (pcVar12 == (cbtBroadphasePair *)0x0) {
    iVar11 = (this->m_overlappingPairArray).m_size;
    if (iVar11 == iVar1) {
      iVar6 = 1;
      if (iVar11 != 0) {
        iVar6 = iVar11 * 2;
      }
      if (iVar1 < iVar6) {
        if (iVar6 == 0) {
          pcVar4 = (cbtBroadphasePair *)0x0;
        }
        else {
          pcVar4 = (cbtBroadphasePair *)cbtAlignedAllocInternal((long)iVar6 << 5,0x10);
        }
        lVar5 = (long)(this->m_overlappingPairArray).m_size;
        if (0 < lVar5) {
          lVar7 = 0;
          do {
            pcVar12 = (this->m_overlappingPairArray).m_data;
            *(undefined8 *)((long)&pcVar4->m_pProxy0 + lVar7) =
                 *(undefined8 *)((long)&pcVar12->m_pProxy0 + lVar7);
            *(undefined8 *)((long)&pcVar4->m_pProxy1 + lVar7) =
                 *(undefined8 *)((long)&pcVar12->m_pProxy1 + lVar7);
            *(undefined8 *)((long)&pcVar4->m_algorithm + lVar7) =
                 *(undefined8 *)((long)&pcVar12->m_algorithm + lVar7);
            *(undefined8 *)((long)&pcVar4->field_3 + lVar7) =
                 *(undefined8 *)((long)&pcVar12->field_3 + lVar7);
            lVar7 = lVar7 + 0x20;
          } while (lVar5 * 0x20 != lVar7);
        }
        pcVar12 = (this->m_overlappingPairArray).m_data;
        if (pcVar12 != (cbtBroadphasePair *)0x0) {
          if ((this->m_overlappingPairArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(pcVar12);
          }
          (this->m_overlappingPairArray).m_data = (cbtBroadphasePair *)0x0;
        }
        (this->m_overlappingPairArray).m_ownsMemory = true;
        (this->m_overlappingPairArray).m_data = pcVar4;
        (this->m_overlappingPairArray).m_capacity = iVar6;
      }
    }
    piVar3 = &(this->m_overlappingPairArray).m_size;
    *piVar3 = *piVar3 + 1;
    pcVar12 = (this->m_overlappingPairArray).m_data + iVar11;
    pcVar2 = this->m_ghostPairCallback;
    if (pcVar2 != (cbtOverlappingPairCallback *)0x0) {
      (*pcVar2->_vptr_cbtOverlappingPairCallback[2])(pcVar2,proxy0,pcVar9);
    }
    if (iVar1 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar10 = (this->m_overlappingPairArray).m_capacity - 1U & uVar8;
    }
    pcVar13 = proxy0;
    if (proxy0->m_uniqueId < pcVar9->m_uniqueId) {
      pcVar13 = pcVar9;
      pcVar9 = proxy0;
    }
    pcVar12->m_pProxy0 = pcVar9;
    pcVar12->m_pProxy1 = pcVar13;
    pcVar12->m_algorithm = (cbtCollisionAlgorithm *)0x0;
    (pcVar12->field_3).m_internalInfo1 = (void *)0x0;
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar11] = piVar3[(int)uVar10];
    piVar3[(int)uVar10] = iVar11;
  }
  return pcVar12;
}

Assistant:

cbtBroadphasePair* cbtHashedOverlappingPairCache::internalAddPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1)
{
	if (proxy0->m_uniqueId > proxy1->m_uniqueId)
		cbtSwap(proxy0, proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		cbtSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));  // New hash value with new mask

	cbtBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));
	}

	pair = new (mem) cbtBroadphasePair(*proxy0, *proxy1);
	//	pair->m_pProxy0 = proxy0;
	//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}